

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::VM(VM *this,File *file)

{
  File *file_local;
  VM *this_local;
  
  File::File(&this->_file,file);
  std::unique_ptr<int[],std::default_delete<int[]>>::unique_ptr<std::default_delete<int[]>,void>
            ((unique_ptr<int[],std::default_delete<int[]>> *)&this->_stack);
  std::unique_ptr<int[],std::default_delete<int[]>>::unique_ptr<std::default_delete<int[]>,void>
            ((unique_ptr<int[],std::default_delete<int[]>> *)&this->_heap);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&this->_heapRecord);
  std::vector<vm::VM::Context,_std::allocator<vm::VM::Context>_>::vector(&this->_contexts);
  std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::vector
            (&this->_currentInstructions);
  std::
  unordered_map<unsigned_short,_int,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_int>_>_>
  ::unordered_map(&this->_stringLiteralPool);
  init(this,(EVP_PKEY_CTX *)file);
  return;
}

Assistant:

VM::VM(File file) noexcept : _file(std::move(file)){
    init();
}